

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O2

timespec timespec_add(timespec ts1,timespec ts2)

{
  timespec tVar1;
  timespec tVar2;
  timespec tVar3;
  
  tVar1 = timespec_normalise(ts1);
  tVar2 = timespec_normalise(ts2);
  tVar3.tv_nsec = tVar1.tv_nsec + tVar2.tv_nsec;
  tVar3.tv_sec = tVar1.tv_sec + tVar2.tv_sec;
  tVar3 = timespec_normalise(tVar3);
  return tVar3;
}

Assistant:

static struct timespec timespec_add(struct timespec ts1, struct timespec ts2)
{
	/*
	 * Normalize inputs to prevent tv_nsec rollover if
	 * whole-second values are packed in it.
	 */
	ts1 = timespec_normalise(ts1);
	ts2 = timespec_normalise(ts2);

	ts1.tv_sec += ts2.tv_sec;
	ts1.tv_nsec += ts2.tv_nsec;

	return timespec_normalise(ts1);
}